

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayoutState::fitLayout(QMainWindowLayoutState *this)

{
  Representation RVar1;
  Representation RVar2;
  Representation RVar3;
  QRect QVar4;
  
  RVar1.m_i = (this->rect).y1.m_i;
  RVar2.m_i = (this->rect).x2.m_i;
  RVar3.m_i = (this->rect).y2.m_i;
  (this->toolBarAreaLayout).rect.x1 = (Representation)(this->rect).x1.m_i;
  (this->toolBarAreaLayout).rect.y1 = (Representation)RVar1.m_i;
  (this->toolBarAreaLayout).rect.x2 = (Representation)RVar2.m_i;
  (this->toolBarAreaLayout).rect.y2 = (Representation)RVar3.m_i;
  QVar4 = QToolBarAreaLayout::fitLayout(&this->toolBarAreaLayout);
  (this->dockAreaLayout).rect = QVar4;
  QDockAreaLayout::fitLayout(&this->dockAreaLayout);
  return;
}

Assistant:

void QMainWindowLayoutState::fitLayout()
{
    QRect r;
#if !QT_CONFIG(toolbar)
    r = rect;
#else
    toolBarAreaLayout.rect = rect;
    r = toolBarAreaLayout.fitLayout();
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(dockwidget)
    dockAreaLayout.rect = r;
    dockAreaLayout.fitLayout();
#else
    centralWidgetRect = r;
#endif
}